

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

RROutput __thiscall
sf::priv::WindowImplX11::getOutputPrimary
          (WindowImplX11 *this,Window *rootWindow,XRRScreenResources *res,int xRandRMajor,
          int xRandRMinor)

{
  int in_ECX;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int in_R8D;
  RROutput output;
  RROutput local_8;
  
  if (((in_ECX == 1) && (2 < in_R8D)) || (1 < in_ECX)) {
    local_8 = XRRGetOutputPrimary(*(undefined8 *)(in_RDI + 0x3d0),*in_RSI);
    if (local_8 == 0) {
      local_8 = **(RROutput **)(in_RDX + 0x28);
    }
  }
  else {
    local_8 = **(RROutput **)(in_RDX + 0x28);
  }
  return local_8;
}

Assistant:

RROutput WindowImplX11::getOutputPrimary(::Window& rootWindow, XRRScreenResources* res, int xRandRMajor, int xRandRMinor)
{
    // if xRandR version >= 1.3 get the primary screen else take the first screen
    if ((xRandRMajor == 1 && xRandRMinor >= 3) || xRandRMajor > 1)
    {
        RROutput output = XRRGetOutputPrimary(m_display, rootWindow);

        // Check if returned output is valid, otherwise use the first screen
        if (output == None)
            return res->outputs[0];
        else
            return output;
    }

    // xRandr version can't get the primary screen, use the first screen
    return res->outputs[0];
}